

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void uv__udp_recvmsg(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  code *pcVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int *piVar5;
  uint in_EDX;
  long in_RSI;
  bool bVar6;
  int count;
  int flags;
  uv_buf_t buf;
  ssize_t nread;
  uv_udp_t *handle;
  msghdr h;
  sockaddr_storage peer;
  int local_f8;
  undefined4 local_f4;
  iovec local_f0;
  ssize_t local_e0;
  long local_d8;
  msghdr local_d0;
  undefined1 local_98 [152];
  
  local_d8 = in_RSI + -0x50;
  if (*(int *)(in_RSI + -0x38) != 0xf) {
    __assert_fail("handle->type == UV_UDP","src/unix/udp.c",0xb0,
                  "void uv__udp_recvmsg(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((in_EDX & 1) == 0) {
    __assert_fail("revents & UV__POLLIN","src/unix/udp.c",0xb1,
                  "void uv__udp_recvmsg(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (*(long *)(in_RSI + -8) == 0) {
    __assert_fail("handle->recv_cb != NULL","src/unix/udp.c",0xb3,
                  "void uv__udp_recvmsg(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (*(long *)(in_RSI + -0x10) != 0) {
    local_f8 = 0x20;
    memset(&local_d0,0,0x38);
    local_d0.msg_name = local_98;
    while( true ) {
      (**(code **)(local_d8 + 0x40))(local_d8,0x10000,&local_f0);
      if (local_f0.iov_len == 0) {
        (**(code **)(local_d8 + 0x48))(local_d8,0xffffffffffffff97,&local_f0,0,0);
        return;
      }
      if (local_f0.iov_base == (void *)0x0) break;
      local_d0.msg_namelen = 0x80;
      local_d0.msg_iov = &local_f0;
      local_d0.msg_iovlen = 1;
      do {
        local_e0 = recvmsg(*(int *)(local_d8 + 0x80),&local_d0,0);
        bVar6 = false;
        if (local_e0 == -1) {
          piVar5 = __errno_location();
          bVar6 = *piVar5 == 4;
        }
      } while (bVar6);
      if (local_e0 == -1) {
        piVar5 = __errno_location();
        if ((*piVar5 == 0xb) || (piVar5 = __errno_location(), lVar3 = local_d8, *piVar5 == 0xb)) {
          (**(code **)(local_d8 + 0x48))(local_d8,0,&local_f0);
        }
        else {
          pcVar1 = *(code **)(local_d8 + 0x48);
          piVar5 = __errno_location();
          (*pcVar1)(lVar3,(long)-*piVar5,&local_f0,0,0);
        }
      }
      else {
        local_f4 = 0;
        if ((local_d0.msg_flags & 0x20U) != 0) {
          local_f4 = 2;
        }
        (**(code **)(local_d8 + 0x48))(local_d8,local_e0,&local_f0,local_98,local_f4);
      }
      bVar6 = false;
      if (local_e0 != -1) {
        iVar4 = local_f8 + -1;
        bVar6 = false;
        bVar2 = 0 < local_f8;
        local_f8 = iVar4;
        if ((bVar2) && (bVar6 = false, *(int *)(local_d8 + 0x80) != -1)) {
          bVar6 = *(long *)(local_d8 + 0x48) != 0;
        }
      }
      if (!bVar6) {
        return;
      }
    }
    __assert_fail("buf.base != NULL","src/unix/udp.c",0xc4,
                  "void uv__udp_recvmsg(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  __assert_fail("handle->alloc_cb != NULL","src/unix/udp.c",0xb4,
                "void uv__udp_recvmsg(uv_loop_t *, uv__io_t *, unsigned int)");
}

Assistant:

static void uv__udp_recvmsg(uv_loop_t* loop,
                            uv__io_t* w,
                            unsigned int revents) {
  struct sockaddr_storage peer;
  struct msghdr h;
  uv_udp_t* handle;
  ssize_t nread;
  uv_buf_t buf;
  int flags;
  int count;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);
  assert(revents & UV__POLLIN);

  assert(handle->recv_cb != NULL);
  assert(handle->alloc_cb != NULL);

  /* Prevent loop starvation when the data comes in as fast as (or faster than)
   * we can read it. XXX Need to rearm fd if we switch to edge-triggered I/O.
   */
  count = 32;

  memset(&h, 0, sizeof(h));
  h.msg_name = &peer;

  do {
    handle->alloc_cb((uv_handle_t*) handle, 64 * 1024, &buf);
    if (buf.len == 0) {
      handle->recv_cb(handle, UV_ENOBUFS, &buf, NULL, 0);
      return;
    }
    assert(buf.base != NULL);

    h.msg_namelen = sizeof(peer);
    h.msg_iov = (void*) &buf;
    h.msg_iovlen = 1;

    do {
      nread = recvmsg(handle->io_watcher.fd, &h, 0);
    }
    while (nread == -1 && errno == EINTR);

    if (nread == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK)
        handle->recv_cb(handle, 0, &buf, NULL, 0);
      else
        handle->recv_cb(handle, -errno, &buf, NULL, 0);
    }
    else {
      flags = 0;

      if (h.msg_flags & MSG_TRUNC)
        flags |= UV_UDP_PARTIAL;

      handle->recv_cb(handle,
                      nread,
                      &buf,
                      (const struct sockaddr*) &peer,
                      flags);
    }
  }
  /* recv_cb callback may decide to pause or close the handle */
  while (nread != -1
      && count-- > 0
      && handle->io_watcher.fd != -1
      && handle->recv_cb != NULL);
}